

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::ModifyAfterWithBufferSubDataCase::testWithBufferSize
          (ModifyAfterWithBufferSubDataCase *this,
          UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          *result,int bufferSize)

{
  code *pcVar1;
  deInt32 begin;
  deInt32 end;
  int iVar2;
  deInt32 dVar3;
  deInt32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  reference pvVar6;
  deUint64 dVar7;
  deUint64 dVar8;
  deInt32 local_60;
  deInt32 local_5c;
  int local_4c;
  int repeatNdx;
  deUint64 endTime;
  deUint64 startTime;
  int subdataSize;
  int subdataOffset;
  Functions *gl;
  int drawEnd;
  int drawStart;
  int bufferSize_local;
  UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
  *result_local;
  ModifyAfterWithBufferSubDataCase *this_local;
  
  begin = deAlign32(bufferSize / 4,0x10);
  end = deAlign32((bufferSize * 3) / 4,0x10);
  pRVar5 = gles3::Context::getRenderContext
                     ((this->
                      super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                      ).
                      super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                      .super_TestCase.m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  if ((this->m_partialUpload & 1U) == 0) {
    local_5c = 0;
  }
  else {
    local_5c = bufferSize / 4;
  }
  dVar3 = deAlign32(local_5c,0x10);
  local_60 = bufferSize;
  if ((this->m_partialUpload & 1U) != 0) {
    local_60 = bufferSize / 2;
  }
  dVar4 = deAlign32(local_60,0x10);
  if ((this->m_repeatedUpload & 1U) != 0) {
    for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
      pcVar1 = *(code **)(CONCAT44(extraout_var,iVar2) + 0x168);
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&(this->
                           super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                           ).m_zeroData,0);
      (*pcVar1)(0x8892,(long)dVar3,(long)dVar4,pvVar6);
      ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
      ::drawBufferRange(&this->
                         super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                        ,begin,end);
    }
  }
  dVar7 = deGetMicroseconds();
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar2) + 0x168);
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&(this->
                       super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                       ).m_zeroData,0);
  (*pcVar1)(0x8892,(long)dVar3,(long)dVar4,pvVar6);
  dVar8 = deGetMicroseconds();
  (result->duration).totalDuration = dVar8 - dVar7;
  (result->duration).fitResponseDuration = (result->duration).totalDuration;
  result->writtenSize = dVar4;
  return;
}

Assistant:

void ModifyAfterWithBufferSubDataCase::testWithBufferSize (UploadSampleResult<SingleOperationDuration>& result, int bufferSize)
{
	// always draw the same amount to make compares between cases sensible
	const int					drawStart			= deAlign32(bufferSize / 4, 4*4);
	const int					drawEnd				= deAlign32(bufferSize * 3 / 4, 4*4);

	const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();
	const int					subdataOffset		= deAlign32((m_partialUpload) ? (bufferSize / 4) : (0), 4*4);
	const int					subdataSize			= deAlign32((m_partialUpload) ? (bufferSize / 2) : (bufferSize), 4*4);
	deUint64					startTime;
	deUint64					endTime;

	// make upload-draw stream
	if (m_repeatedUpload)
	{
		for (int repeatNdx = 0; repeatNdx < NUM_REPEATS; ++repeatNdx)
		{
			gl.bufferSubData(GL_ARRAY_BUFFER, subdataOffset, subdataSize, &m_zeroData[0]);
			drawBufferRange(drawStart, drawEnd);
		}
	}

	// test upload
	startTime = deGetMicroseconds();
	gl.bufferSubData(GL_ARRAY_BUFFER, subdataOffset, subdataSize, &m_zeroData[0]);
	endTime = deGetMicroseconds();

	result.duration.totalDuration = endTime - startTime;
	result.duration.fitResponseDuration = result.duration.totalDuration;
	result.writtenSize = subdataSize;
}